

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

CURLcode Curl_alpn_to_proto_str(alpn_proto_buf *buf,alpn_spec *spec)

{
  size_t __n;
  ulong uVar1;
  long lVar2;
  alpn_spec *__s;
  
  buf->data[0x10] = '\0';
  buf->data[0x11] = '\0';
  buf->data[0x12] = '\0';
  buf->data[0x13] = '\0';
  buf->data[0x14] = '\0';
  buf->data[0x15] = '\0';
  buf->data[0x16] = '\0';
  buf->data[0x17] = '\0';
  buf->data[0x18] = '\0';
  buf->data[0x19] = '\0';
  buf->data[0x1a] = '\0';
  buf->data[0x1b] = '\0';
  buf->data[0x1c] = '\0';
  buf->data[0x1d] = '\0';
  buf->data[0x1e] = '\0';
  buf->data[0x1f] = '\0';
  buf->data[0] = '\0';
  buf->data[1] = '\0';
  buf->data[2] = '\0';
  buf->data[3] = '\0';
  buf->data[4] = '\0';
  buf->data[5] = '\0';
  buf->data[6] = '\0';
  buf->data[7] = '\0';
  buf->data[8] = '\0';
  buf->data[9] = '\0';
  buf->data[10] = '\0';
  buf->data[0xb] = '\0';
  buf->data[0xc] = '\0';
  buf->data[0xd] = '\0';
  buf->data[0xe] = '\0';
  buf->data[0xf] = '\0';
  *(undefined8 *)(buf->data + 0x20) = 0;
  uVar1 = 0;
  lVar2 = 0;
  __s = spec;
  while (spec != (alpn_spec *)0x0) {
    if (spec->count <= uVar1) goto LAB_0016b727;
    __n = strlen((char *)__s);
    if ((9 < __n) || ((__n + lVar2) - 0x1f < 0xffffffffffffffdf)) {
      return CURLE_FAILED_INIT;
    }
    if (lVar2 == 0) {
      lVar2 = 0;
    }
    else {
      buf->data[lVar2] = ',';
      lVar2 = lVar2 + 1;
    }
    memcpy(buf->data + lVar2,__s,__n);
    lVar2 = lVar2 + __n;
    uVar1 = uVar1 + 1;
    __s = (alpn_spec *)(__s->entries + 1);
  }
  lVar2 = 0;
LAB_0016b727:
  buf->data[lVar2] = '\0';
  buf->len = (int)lVar2;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_alpn_to_proto_str(struct alpn_proto_buf *buf,
                                const struct alpn_spec *spec)
{
  size_t i, len;
  size_t off = 0;

  memset(buf, 0, sizeof(*buf));
  for(i = 0; spec && i < spec->count; ++i) {
    len = strlen(spec->entries[i]);
    if(len >= ALPN_NAME_MAX)
      return CURLE_FAILED_INIT;
    if(off + len + 2 >= sizeof(buf->data))
      return CURLE_FAILED_INIT;
    if(off)
      buf->data[off++] = ',';
    memcpy(buf->data + off, spec->entries[i], len);
    off += len;
  }
  buf->data[off] = '\0';
  buf->len = (int)off;
  return CURLE_OK;
}